

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void verifyTinySVD_4x4<float>(Matrix44<float> *A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int i;
  long lVar11;
  float *pfVar12;
  float (*pafVar13) [4];
  int j;
  long lVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  Matrix44<float> V;
  Matrix44<float> S_times_Vt;
  Vec4<float> S;
  Matrix44<float> U;
  Matrix44<float> local_1c8;
  float local_188 [16];
  undefined1 local_148 [16];
  float local_138 [4];
  float local_128;
  undefined8 local_124;
  undefined8 uStack_11c;
  float local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  float local_100;
  undefined8 local_fc;
  undefined8 uStack_f4;
  float local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar17 = 0.0;
  lVar11 = 0;
  pafVar13 = (float (*) [4])A;
  do {
    lVar14 = 0;
    fVar18 = fVar17;
    do {
      fVar17 = ABS((*(float (*) [4])*pafVar13)[lVar14]);
      if (fVar17 <= fVar18) {
        fVar17 = fVar18;
      }
      lVar14 = lVar14 + 1;
      fVar18 = fVar17;
    } while (lVar14 != 4);
    lVar11 = lVar11 + 1;
    pafVar13 = pafVar13 + 1;
  } while (lVar11 != 4);
  local_98 = ZEXT416((uint)(fVar17 * 100.0 * 1.1920929e-07));
  bVar15 = true;
  do {
    local_128 = 1.0;
    local_124 = 0;
    uStack_11c = 0;
    local_114 = 1.0;
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 1.0;
    local_fc = 0;
    uStack_f4 = 0;
    local_ec = 1.0;
    local_1c8.x[0][0] = 1.0;
    local_1c8.x[0][1] = 0.0;
    local_1c8.x[0][2] = 0.0;
    local_1c8.x[0][3] = 0.0;
    local_1c8.x[1][0] = 0.0;
    local_1c8.x[1][1] = 1.0;
    local_1c8.x[1][2] = 0.0;
    local_1c8.x[1][3] = 0.0;
    local_1c8.x[2][0] = 0.0;
    local_1c8.x[2][1] = 0.0;
    local_1c8.x[2][2] = 1.0;
    local_1c8.x[2][3] = 0.0;
    local_1c8.x[3][0] = 0.0;
    local_1c8.x[3][1] = 0.0;
    local_1c8.x[3][2] = 0.0;
    local_1c8.x[3][3] = 1.0;
    Imath_3_2::jacobiSVD<float>
              ((Matrix44 *)A,(Matrix44 *)&local_128,(Vec4 *)local_138,(Matrix44 *)&local_1c8,
               1.1920929e-07,bVar15);
    local_188[0] = 1.0;
    local_188[1] = 0.0;
    local_188[2] = 0.0;
    local_188[3] = 0.0;
    local_188[4] = 0.0;
    local_188[5] = 1.0;
    local_188[6] = 0.0;
    local_188[7] = 0.0;
    local_188[8] = 0.0;
    local_188[9] = 0.0;
    local_188[10] = 1.0;
    local_188[0xb] = 0.0;
    local_188[0xc] = 0.0;
    local_188[0xd] = 0.0;
    local_188[0xe] = 0.0;
    local_188[0xf] = 1.0;
    lVar11 = 0;
    do {
      fVar17 = *(float *)((long)local_1c8.x[0] + lVar11 + 4);
      fVar18 = *(float *)((long)local_1c8.x[0] + lVar11 + 8);
      fVar1 = *(float *)((long)local_1c8.x[0] + lVar11 + 0xc);
      *(float *)((long)local_188 + lVar11) =
           *(float *)((long)local_1c8.x[0] + lVar11) * local_138[0];
      *(float *)((long)local_188 + lVar11 + 4) = fVar17 * local_138[1];
      fVar17 = local_188[1];
      *(float *)((long)local_188 + lVar11 + 8) = fVar18 * local_138[2];
      fVar18 = local_188[2];
      *(float *)((long)local_188 + lVar11 + 0xc) = fVar1 * local_138[3];
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x40);
    fVar2 = local_188[4];
    fVar5 = local_188[8];
    fVar8 = local_188[0xc];
    fVar6 = local_188[9];
    fVar9 = local_188[0xd];
    fVar3 = local_188[6];
    fVar10 = local_188[0xe];
    fVar1 = local_188[3];
    fVar4 = local_188[7];
    fVar7 = local_188[0xb];
    local_188[1] = local_188[4];
    local_188[2] = local_188[8];
    local_188[4] = fVar17;
    local_188[3] = local_188[0xc];
    local_188[7] = local_188[0xd];
    local_188[6] = local_188[9];
    local_188[9] = fVar3;
    local_188[8] = fVar18;
    local_188[0xc] = fVar1;
    local_188[0xb] = local_188[0xe];
    local_188[0xe] = fVar7;
    local_188[0xd] = fVar4;
    local_c8 = ZEXT416((uint)(float)local_124);
    local_a8 = ZEXT416((uint)local_128);
    local_b8 = ZEXT416((uint)local_124._4_4_);
    local_88 = ZEXT416((uint)(float)uStack_11c);
    local_78 = (float)uStack_11c * fVar1 +
               local_124._4_4_ * fVar18 + local_128 * local_188[0] + (float)local_124 * fVar17;
    fStack_74 = (float)uStack_11c * fVar4 +
                local_124._4_4_ * fVar3 + local_128 * fVar2 + (float)local_124 * local_188[5];
    fStack_70 = (float)uStack_11c * fVar7 +
                local_124._4_4_ * local_188[10] + local_128 * fVar5 + (float)local_124 * fVar6;
    fStack_6c = (float)uStack_11c * local_188[0xf] +
                local_124._4_4_ * fVar10 + local_128 * fVar8 + (float)local_124 * fVar9;
    local_d8 = ZEXT416((uint)local_114);
    local_e8 = ZEXT416((uint)uStack_11c._4_4_);
    local_68 = local_110._4_4_ * fVar1 +
               (float)local_110 * fVar18 + uStack_11c._4_4_ * local_188[0] + local_114 * fVar17;
    fStack_64 = local_110._4_4_ * fVar4 +
                (float)local_110 * fVar3 + uStack_11c._4_4_ * fVar2 + local_114 * local_188[5];
    fStack_60 = local_110._4_4_ * fVar7 +
                (float)local_110 * local_188[10] + uStack_11c._4_4_ * fVar5 + local_114 * fVar6;
    fStack_5c = local_110._4_4_ * local_188[0xf] +
                (float)local_110 * fVar10 + uStack_11c._4_4_ * fVar8 + local_114 * fVar9;
    local_148 = ZEXT416((uint)uStack_108._4_4_);
    local_58 = (float)local_fc * fVar1 +
               local_100 * fVar18 + (float)uStack_108 * local_188[0] + uStack_108._4_4_ * fVar17;
    fStack_54 = (float)local_fc * fVar4 +
                local_100 * fVar3 + (float)uStack_108 * fVar2 + uStack_108._4_4_ * local_188[5];
    fStack_50 = (float)local_fc * fVar7 +
                local_100 * local_188[10] + (float)uStack_108 * fVar5 + uStack_108._4_4_ * fVar6;
    fStack_4c = (float)local_fc * local_188[0xf] +
                local_100 * fVar10 + (float)uStack_108 * fVar8 + uStack_108._4_4_ * fVar9;
    local_48 = local_ec * fVar1 +
               uStack_f4._4_4_ * fVar18 + local_fc._4_4_ * local_188[0] + (float)uStack_f4 * fVar17;
    fStack_44 = local_ec * fVar4 +
                uStack_f4._4_4_ * fVar3 + local_fc._4_4_ * fVar2 + (float)uStack_f4 * local_188[5];
    fStack_40 = local_ec * fVar7 +
                uStack_f4._4_4_ * local_188[10] + local_fc._4_4_ * fVar5 + (float)uStack_f4 * fVar6;
    fStack_3c = local_ec * local_188[0xf] +
                uStack_f4._4_4_ * fVar10 + local_fc._4_4_ * fVar8 + (float)uStack_f4 * fVar9;
    pfVar12 = &local_78;
    lVar11 = 0;
    pafVar13 = (float (*) [4])A;
    do {
      lVar14 = 0;
      do {
        if ((float)local_98._0_4_ < ABS(pfVar12[lVar14] - (*(float (*) [4])*pafVar13)[lVar14])) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x8b,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      lVar11 = lVar11 + 1;
      pafVar13 = pafVar13 + 1;
      pfVar12 = pfVar12 + 4;
    } while (lVar11 != 4);
    if (bVar15 != false) {
      fVar17 = 0.0;
      if (((float)uStack_11c != 0.0) || (NAN((float)uStack_11c))) {
        fVar17 = 0.0 - (float)uStack_11c *
                       (((float)uStack_108 * (float)uStack_f4 - local_fc._4_4_ * uStack_108._4_4_) *
                        (float)local_110 +
                       (uStack_108._4_4_ * uStack_f4._4_4_ - (float)uStack_f4 * local_100) *
                       uStack_11c._4_4_ +
                       (local_100 * local_fc._4_4_ - uStack_f4._4_4_ * (float)uStack_108) *
                       local_114);
      }
      if ((local_110._4_4_ != 0.0) || (NAN(local_110._4_4_))) {
        fVar17 = fVar17 + local_110._4_4_ *
                          (((float)uStack_108 * (float)uStack_f4 - local_fc._4_4_ * uStack_108._4_4_
                           ) * local_124._4_4_ +
                          (uStack_108._4_4_ * uStack_f4._4_4_ - (float)uStack_f4 * local_100) *
                          local_128 +
                          (local_100 * local_fc._4_4_ - uStack_f4._4_4_ * (float)uStack_108) *
                          (float)local_124);
      }
      if (((float)local_fc != 0.0) || (NAN((float)local_fc))) {
        fVar17 = fVar17 - (float)local_fc *
                          ((uStack_11c._4_4_ * (float)uStack_f4 - local_fc._4_4_ * local_114) *
                           local_124._4_4_ +
                          (local_114 * uStack_f4._4_4_ - (float)uStack_f4 * (float)local_110) *
                          local_128 +
                          ((float)local_110 * local_fc._4_4_ - uStack_f4._4_4_ * uStack_11c._4_4_) *
                          (float)local_124);
      }
      if ((local_ec != 0.0) || (NAN(local_ec))) {
        fVar17 = fVar17 + local_ec *
                          (local_124._4_4_ *
                           (uStack_11c._4_4_ * uStack_108._4_4_ - (float)uStack_108 * local_114) +
                          local_128 * (local_114 * local_100 - uStack_108._4_4_ * (float)local_110)
                          + (float)local_124 *
                            ((float)local_110 * (float)uStack_108 - local_100 * uStack_11c._4_4_));
      }
      if (fVar17 <= 0.99) {
        __assert_fail("U.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x90,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
      fVar17 = 0.0;
      if ((local_1c8.x[0][3] != 0.0) || (NAN(local_1c8.x[0][3]))) {
        fVar17 = 0.0 - local_1c8.x[0][3] *
                       ((local_1c8.x[2][0] * local_1c8.x[3][1] -
                        local_1c8.x[3][0] * local_1c8.x[2][1]) * local_1c8.x[1][2] +
                       (local_1c8.x[2][1] * local_1c8.x[3][2] -
                       local_1c8.x[3][1] * local_1c8.x[2][2]) * local_1c8.x[1][0] +
                       (local_1c8.x[2][2] * local_1c8.x[3][0] -
                       local_1c8.x[3][2] * local_1c8.x[2][0]) * local_1c8.x[1][1]);
      }
      if ((local_1c8.x[1][3] != 0.0) || (NAN(local_1c8.x[1][3]))) {
        fVar17 = fVar17 + local_1c8.x[1][3] *
                          ((local_1c8.x[2][0] * local_1c8.x[3][1] -
                           local_1c8.x[3][0] * local_1c8.x[2][1]) * local_1c8.x[0][2] +
                          (local_1c8.x[2][1] * local_1c8.x[3][2] -
                          local_1c8.x[3][1] * local_1c8.x[2][2]) * local_1c8.x[0][0] +
                          (local_1c8.x[2][2] * local_1c8.x[3][0] -
                          local_1c8.x[3][2] * local_1c8.x[2][0]) * local_1c8.x[0][1]);
      }
      if ((local_1c8.x[2][3] != 0.0) || (NAN(local_1c8.x[2][3]))) {
        fVar17 = fVar17 - local_1c8.x[2][3] *
                          ((local_1c8.x[1][0] * local_1c8.x[3][1] -
                           local_1c8.x[3][0] * local_1c8.x[1][1]) * local_1c8.x[0][2] +
                          (local_1c8.x[1][1] * local_1c8.x[3][2] -
                          local_1c8.x[3][1] * local_1c8.x[1][2]) * local_1c8.x[0][0] +
                          (local_1c8.x[1][2] * local_1c8.x[3][0] -
                          local_1c8.x[3][2] * local_1c8.x[1][0]) * local_1c8.x[0][1]);
      }
      if ((local_1c8.x[3][3] != 0.0) || (NAN(local_1c8.x[3][3]))) {
        fVar17 = fVar17 + local_1c8.x[3][3] *
                          ((local_1c8.x[1][0] * local_1c8.x[2][1] -
                           local_1c8.x[2][0] * local_1c8.x[1][1]) * local_1c8.x[0][2] +
                          (local_1c8.x[1][1] * local_1c8.x[2][2] -
                          local_1c8.x[2][1] * local_1c8.x[1][2]) * local_1c8.x[0][0] +
                          (local_1c8.x[1][2] * local_1c8.x[2][0] -
                          local_1c8.x[2][2] * local_1c8.x[1][0]) * local_1c8.x[0][1]);
      }
      if (fVar17 <= 0.99) {
        __assert_fail("V.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x91,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    lVar11 = 1;
    while (lVar11 != 4) {
      lVar14 = lVar11 + -1;
      pfVar12 = local_138 + lVar11;
      lVar11 = lVar11 + 1;
      if (local_138[lVar14] < *pfVar12) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x96,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    lVar11 = 0;
    do {
      if (local_138[lVar11] < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x9a,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    if (local_138[3] < 0.0 && bVar15 == false) {
      __assert_fail("S[3] >= T (0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                    ,0x9c,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
    }
    verifyOrthonormal<float>((Matrix44<float> *)&local_128);
    verifyOrthonormal<float>(&local_1c8);
    bVar16 = bVar15 == false;
    bVar15 = false;
    if (bVar16) {
      return;
    }
  } while( true );
}

Assistant:

void
verifyTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (100) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec4<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix44<T> product = U * S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V have positive determinant if requested:
        if (posDet)
        {
            assert (U.determinant () > 0.99);
            assert (V.determinant () > 0.99);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[3] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}